

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O1

int lex_scan(lex_t *lex,json_error_t *error)

{
  strbuffer_t *strbuff;
  byte *pbVar1;
  anon_union_16_3_477c3ef1_for_value *paVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  ulong uVar8;
  ulong extraout_RAX;
  byte *buffer;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  char *pcVar9;
  json_error_code code;
  byte *pbVar10;
  bool bVar11;
  char *end;
  char *local_50;
  anon_union_16_3_477c3ef1_for_value *local_48;
  byte *local_40;
  char *local_38;
  
  strbuff = &lex->saved_text;
  strbuffer_clear(strbuff);
  if (lex->token == 0x100) {
    jsonp_free((lex->value).string.val);
    (lex->value).string.val = (char *)0x0;
    (lex->value).string.len = 0;
  }
  do {
    uVar4 = stream_get(&lex->stream,error);
    uVar8 = (ulong)(uVar4 + 2);
    if (0x22 < uVar4 + 2) goto LAB_0011865e;
  } while ((0x400009800U >> (uVar8 & 0x3f) & 1) != 0);
  if (uVar8 == 0) {
LAB_00118943:
    lex->token = -1;
    goto LAB_0011894a;
  }
  if (uVar8 == 1) {
    lex->token = 0;
    goto LAB_0011894a;
  }
LAB_0011865e:
  strbuffer_append_byte(strbuff,(char)uVar4);
  uVar8 = (ulong)(uVar4 - 0x22);
  if (uVar4 - 0x22 < 0x3c) {
    if ((0xa00000001000400U >> (uVar8 & 0x3f) & 1) == 0) {
      if (uVar8 == 0) {
        local_48 = &lex->value;
        (lex->value).string.val = (char *)0x0;
        lex->token = -1;
        uVar4 = lex_get_save(lex,error);
LAB_001186ca:
        if (uVar4 != 0xfffffffe) {
          if (uVar4 == 0x22) {
            buffer = (byte *)jsonp_malloc((lex->saved_text).length + 1);
            if (buffer != (byte *)0x0) {
              (local_48->string).val = (char *)buffer;
              pcVar9 = strbuffer_value(strbuff);
              pbVar10 = (byte *)(pcVar9 + 1);
              goto LAB_001189a5;
            }
          }
          else {
            if (uVar4 == 0xffffffff) {
              pcVar9 = "premature end of input";
              code = json_error_premature_end_of_input;
              goto LAB_00118bc8;
            }
            if (0x1f < uVar4) goto code_r0x001186f5;
            lex_unget_unsave(lex,uVar4);
            if (uVar4 == 10) {
              pcVar9 = "unexpected newline";
              goto LAB_00118bbd;
            }
            error_set(error,lex,json_error_invalid_syntax,"control character 0x%x",(ulong)uVar4);
          }
        }
        goto LAB_00118cdd;
      }
      goto LAB_001187a0;
    }
  }
  else {
LAB_001187a0:
    if ((uVar4 != 0x7d) && (uVar4 != 0x7b)) {
      if (uVar4 != 0x2d && 9 < uVar4 - 0x30) {
        if ((uVar4 & 0xffffffdf) - 0x41 < 0x1a) {
          do {
            uVar4 = lex_get_save(lex,error);
          } while ((uVar4 & 0xffffffdf) - 0x41 < 0x1a);
          lex_unget_unsave(lex,uVar4);
          pcVar9 = strbuffer_value(strbuff);
          uVar4 = strcmp(pcVar9,"true");
          uVar8 = (ulong)uVar4;
          if (uVar4 == 0) {
            lex->token = 0x103;
            goto LAB_0011894a;
          }
          uVar4 = strcmp(pcVar9,"false");
          uVar8 = (ulong)uVar4;
          if (uVar4 == 0) {
            lex->token = 0x104;
            goto LAB_0011894a;
          }
          uVar4 = strcmp(pcVar9,"null");
          uVar8 = (ulong)uVar4;
          if (uVar4 == 0) {
            lex->token = 0x105;
            goto LAB_0011894a;
          }
        }
        else {
          lex_save_cached(lex);
          uVar8 = extraout_RAX;
        }
        goto LAB_00118943;
      }
      lex->token = -1;
      if (uVar4 == 0x2d) {
        uVar4 = lex_get_save(lex,error);
      }
      if (uVar4 == 0x30) {
        uVar4 = lex_get_save(lex,error);
        if (9 < uVar4 - 0x30) {
LAB_001188be:
          if ((lex->flags & 8) == 0) {
            if (uVar4 == 0x2e) {
LAB_00118bfd:
              iVar6 = stream_get(&lex->stream,error);
              if (9 < iVar6 - 0x30U) {
                stream_unget(&lex->stream,iVar6);
                uVar8 = extraout_RAX_03;
                goto LAB_0011894a;
              }
              strbuffer_append_byte(strbuff,(char)iVar6);
              do {
                uVar4 = lex_get_save(lex,error);
              } while (uVar4 - 0x30 < 10);
              goto LAB_00118c34;
            }
            if ((uVar4 == 0x45) || (uVar4 == 0x65)) goto LAB_00118c34;
            lex_unget_unsave(lex,uVar4);
            pcVar9 = strbuffer_value(strbuff);
            piVar7 = __errno_location();
            *piVar7 = 0;
            uVar8 = strtoll(pcVar9,&local_50,10);
            if (*piVar7 != 0x22) {
              if (local_50 != pcVar9 + (lex->saved_text).length) {
                __assert_fail("end == saved_text + lex->saved_text.length",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                              ,0x1ff,"int lex_scan_number(lex_t *, int, json_error_t *)");
              }
              lex->token = 0x101;
              (lex->value).integer = uVar8;
              goto LAB_0011894a;
            }
            if ((long)uVar8 < 0) {
              pcVar9 = "too big negative integer";
            }
            else {
              pcVar9 = "too big integer";
            }
          }
          else {
            if (uVar4 == 0x2e) goto LAB_00118bfd;
LAB_00118c34:
            if ((uVar4 & 0xffffffdf) == 0x45) {
              uVar4 = lex_get_save(lex,error);
              if ((uVar4 == 0x2d) || (uVar4 == 0x2b)) {
                uVar4 = lex_get_save(lex,error);
              }
              if (9 < uVar4 - 0x30) goto LAB_00118cb7;
              do {
                uVar4 = lex_get_save(lex,error);
              } while (uVar4 - 0x30 < 10);
            }
            lex_unget_unsave(lex,uVar4);
            uVar4 = jsonp_strtod(strbuff,(double *)&local_38);
            uVar8 = (ulong)uVar4;
            if (uVar4 == 0) {
              lex->token = 0x102;
              (lex->value).string.val = local_38;
              goto LAB_0011894a;
            }
            pcVar9 = "real number overflow";
          }
          error_set(error,lex,json_error_numeric_overflow,pcVar9);
          uVar8 = extraout_RAX_00;
          goto LAB_0011894a;
        }
      }
      else if (uVar4 - 0x30 < 10) {
        do {
          uVar4 = lex_get_save(lex,error);
        } while (uVar4 - 0x30 < 10);
        goto LAB_001188be;
      }
LAB_00118cb7:
      lex_unget_unsave(lex,uVar4);
      uVar8 = extraout_RAX_01;
      goto LAB_0011894a;
    }
  }
  lex->token = uVar4;
LAB_0011894a:
  return (int)uVar8;
LAB_001189a5:
  bVar3 = *pbVar10;
  uVar8 = (ulong)bVar3;
  if (bVar3 != 0x5c) {
    if (bVar3 == 0x22) {
      *buffer = 0;
      (lex->value).string.len = (long)buffer - (lex->value).integer;
      lex->token = 0x100;
      goto LAB_0011894a;
    }
    pbVar10 = pbVar10 + 1;
    *buffer = bVar3;
    buffer = buffer + 1;
    goto LAB_001189a5;
  }
  bVar3 = pbVar10[1];
  if (bVar3 < 0x62) {
    if (((bVar3 != 0x22) && (bVar3 != 0x2f)) && (bVar3 != 0x5c)) goto switchD_001189fd_caseD_6f;
    goto LAB_00118abc;
  }
  switch(bVar3) {
  case 0x6e:
    bVar3 = 10;
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
switchD_001189fd_caseD_6f:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                  ,0x1b7,"void lex_scan_string(lex_t *, json_error_t *)");
  case 0x72:
    bVar3 = 0xd;
    break;
  case 0x74:
    bVar3 = 9;
    break;
  case 0x75:
    uVar4 = decode_unicode_escape((char *)(pbVar10 + 1));
    if ((int)uVar4 < 0) {
      error_set(error,lex,json_error_invalid_syntax,"invalid Unicode escape \'%.6s\'",pbVar10);
      pbVar10 = pbVar10 + 1;
LAB_00118b06:
      uVar8 = 4;
    }
    else {
      pbVar1 = pbVar10 + 6;
      if ((uVar4 & 0x7ffffc00) == 0xdc00) {
LAB_00118aea:
        error_set(error,lex,json_error_invalid_syntax,"invalid Unicode \'\\u%04X\'",(ulong)uVar4);
        pbVar10 = pbVar1;
        goto LAB_00118b06;
      }
      if ((uVar4 & 0x7ffffc00) == 0xd800) {
        if ((*pbVar1 != 0x5c) || (pbVar10[7] != 0x75)) goto LAB_00118aea;
        local_40 = pbVar10 + 7;
        uVar5 = decode_unicode_escape((char *)local_40);
        if ((int)uVar5 < 0) {
          bVar11 = false;
          error_set(error,lex,json_error_invalid_syntax,"invalid Unicode escape \'%.6s\'",pbVar1);
          uVar8 = 4;
          pbVar10 = local_40;
        }
        else if ((uVar5 & 0x7ffffc00) == 0xdc00) {
          uVar4 = uVar4 * 0x400 + uVar5 + 0xfca02400;
          uVar8 = 0;
          bVar11 = true;
          pbVar10 = pbVar10 + 0xc;
        }
        else {
          error_set(error,lex,json_error_invalid_syntax,"invalid Unicode \'\\u%04X\\u%04X\'",
                    (ulong)uVar4,(ulong)uVar5);
          uVar8 = 4;
          bVar11 = false;
          pbVar10 = pbVar10 + 0xc;
        }
        pbVar1 = pbVar10;
        if (bVar11) goto LAB_00118b65;
      }
      else {
LAB_00118b65:
        pbVar10 = pbVar1;
        iVar6 = utf8_encode(uVar4,(char *)buffer,(size_t *)&local_50);
        if (iVar6 != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/jansson/load.c"
                        ,0x19e,"void lex_scan_string(lex_t *, json_error_t *)");
        }
        buffer = buffer + (long)local_50;
        uVar8 = 0;
      }
    }
    if ((int)uVar8 != 0) goto code_r0x00118b96;
    goto LAB_001189a5;
  default:
    if (bVar3 == 0x62) {
      bVar3 = 8;
    }
    else {
      if (bVar3 != 0x66) goto switchD_001189fd_caseD_6f;
      bVar3 = 0xc;
    }
  }
LAB_00118abc:
  *buffer = bVar3;
  buffer = buffer + 1;
  pbVar10 = pbVar10 + 2;
  goto LAB_001189a5;
code_r0x00118b96:
  if ((int)uVar8 == 4) {
LAB_00118cdd:
    paVar2 = local_48;
    jsonp_free((local_48->string).val);
    (paVar2->string).val = (char *)0x0;
    (paVar2->string).len = 0;
    uVar8 = extraout_RAX_02;
  }
  goto LAB_0011894a;
code_r0x001186f5:
  uVar5 = lex_get_save(lex,error);
  bVar11 = uVar4 != 0x5c;
  uVar4 = uVar5;
  if (bVar11) goto LAB_001186ca;
  if ((0x37 < uVar5 - 0x2f) || ((0x88200000000001U >> ((ulong)(uVar5 - 0x2f) & 0x3f) & 1) == 0)) {
    switch(uVar5) {
    case 0x6e:
    case 0x72:
    case 0x74:
      break;
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x73:
switchD_00118724_caseD_6f:
      pcVar9 = "invalid escape";
LAB_00118bbd:
      code = json_error_invalid_syntax;
LAB_00118bc8:
      error_set(error,lex,code,pcVar9);
      goto LAB_00118cdd;
    case 0x75:
      uVar4 = lex_get_save(lex,error);
      iVar6 = 4;
      do {
        if ((9 < uVar4 - 0x30) &&
           ((0x25 < uVar4 - 0x41 || ((0x3f0000003fU >> ((ulong)(uVar4 - 0x41) & 0x3f) & 1) == 0))))
        goto switchD_00118724_caseD_6f;
        uVar4 = lex_get_save(lex,error);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
      goto LAB_001186ca;
    default:
      if (uVar5 != 0x22) goto switchD_00118724_caseD_6f;
    }
  }
  uVar4 = lex_get_save(lex,error);
  goto LAB_001186ca;
}

Assistant:

static int lex_scan(lex_t *lex, json_error_t *error) {
    int c;

    strbuffer_clear(&lex->saved_text);

    if (lex->token == TOKEN_STRING)
        lex_free_string(lex);

    do
        c = lex_get(lex, error);
    while (c == ' ' || c == '\t' || c == '\n' || c == '\r');

    if (c == STREAM_STATE_EOF) {
        lex->token = TOKEN_EOF;
        goto out;
    }

    if (c == STREAM_STATE_ERROR) {
        lex->token = TOKEN_INVALID;
        goto out;
    }

    lex_save(lex, c);

    if (c == '{' || c == '}' || c == '[' || c == ']' || c == ':' || c == ',')
        lex->token = c;

    else if (c == '"')
        lex_scan_string(lex, error);

    else if (l_isdigit(c) || c == '-') {
        if (lex_scan_number(lex, c, error))
            goto out;
    } else if (l_isalpha(c)) {
        /* eat up the whole identifier for clearer error messages */
        const char *saved_text;

        do
            c = lex_get_save(lex, error);
        while (l_isalpha(c));
        lex_unget_unsave(lex, c);

        saved_text = strbuffer_value(&lex->saved_text);

        if (strcmp(saved_text, "true") == 0)
            lex->token = TOKEN_TRUE;
        else if (strcmp(saved_text, "false") == 0)
            lex->token = TOKEN_FALSE;
        else if (strcmp(saved_text, "null") == 0)
            lex->token = TOKEN_NULL;
        else
            lex->token = TOKEN_INVALID;
    } else {
        /* save the rest of the input UTF-8 sequence to get an error
           message of valid UTF-8 */
        lex_save_cached(lex);
        lex->token = TOKEN_INVALID;
    }

    out:
    return lex->token;
}